

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigVec.c
# Opt level: O3

Fraig_NodeVec_t * Fraig_NodeVecDup(Fraig_NodeVec_t *pVec)

{
  int iVar1;
  int iVar2;
  Fraig_NodeVec_t *pFVar3;
  Fraig_Node_t **__dest;
  
  pFVar3 = (Fraig_NodeVec_t *)malloc(0x10);
  iVar1 = pVec->nSize;
  pFVar3->nSize = iVar1;
  iVar2 = pVec->nCap;
  pFVar3->nCap = iVar2;
  if ((long)iVar2 == 0) {
    __dest = (Fraig_Node_t **)0x0;
  }
  else {
    __dest = (Fraig_Node_t **)malloc((long)iVar2 << 3);
  }
  pFVar3->pArray = __dest;
  memcpy(__dest,pVec->pArray,(long)iVar1 << 3);
  return pFVar3;
}

Assistant:

Fraig_NodeVec_t * Fraig_NodeVecDup( Fraig_NodeVec_t * pVec )
{
    Fraig_NodeVec_t * p;
    p = ABC_ALLOC( Fraig_NodeVec_t, 1 );
    p->nSize  = pVec->nSize;
    p->nCap   = pVec->nCap;
    p->pArray = p->nCap? ABC_ALLOC( Fraig_Node_t *, p->nCap ) : NULL;
    memcpy( p->pArray, pVec->pArray, sizeof(Fraig_Node_t *) * pVec->nSize );
    return p;
}